

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::~IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcProfileDef).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->Label).ptr.field_2._M_local_buf + (long)p_Var3;
  *(undefined ***)(pcVar2 + -0x90) = &PTR__IfcCompositeProfileDef_008b2398;
  *(undefined ***)(pcVar2 + 0x18) = &PTR__IfcCompositeProfileDef_008b23e8;
  *(undefined ***)(pcVar2 + -0x38) = &PTR__IfcCompositeProfileDef_008b23c0;
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  if (*(void **)(p_Var1 + 0x68) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + 0x68));
  }
  *(undefined8 *)p_Var1 = 0x8b2410;
  *(undefined8 *)(p_Var1 + 0xa8) = 0x8b2438;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}